

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

uint64_t __thiscall
spvtools::opt::UpgradeMemoryModel::GetIndexValue(UpgradeMemoryModel *this,Instruction *index_inst)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  uint32_t uVar4;
  IRContext *this_00;
  ConstantManager *this_01;
  Constant *this_02;
  undefined4 extraout_var;
  Type *pTVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Constant *index_constant;
  Instruction *index_inst_local;
  UpgradeMemoryModel *this_local;
  
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_constant_mgr(this_00);
  this_02 = analysis::ConstantManager::GetConstantFromInst(this_01,index_inst);
  iVar2 = (*this_02->_vptr_Constant[0xe])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    pTVar5 = analysis::Constant::type(this_02);
    iVar2 = (*pTVar5->_vptr_Type[10])();
    bVar1 = analysis::Integer::IsSigned((Integer *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      pTVar5 = analysis::Constant::type(this_02);
      iVar2 = (*pTVar5->_vptr_Type[10])();
      uVar4 = analysis::Integer::width((Integer *)CONCAT44(extraout_var_01,iVar2));
      if (uVar4 == 0x20) {
        iVar3 = analysis::Constant::GetS32(this_02);
        this_local = (UpgradeMemoryModel *)(long)iVar3;
      }
      else {
        this_local = (UpgradeMemoryModel *)analysis::Constant::GetS64(this_02);
      }
    }
    else {
      pTVar5 = analysis::Constant::type(this_02);
      iVar2 = (*pTVar5->_vptr_Type[10])();
      uVar4 = analysis::Integer::width((Integer *)CONCAT44(extraout_var_02,iVar2));
      if (uVar4 == 0x20) {
        uVar4 = analysis::Constant::GetU32(this_02);
        this_local = (UpgradeMemoryModel *)(ulong)uVar4;
      }
      else {
        this_local = (UpgradeMemoryModel *)analysis::Constant::GetU64(this_02);
      }
    }
    return (uint64_t)this_local;
  }
  __assert_fail("index_constant->AsIntConstant()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                ,0x1ee,"uint64_t spvtools::opt::UpgradeMemoryModel::GetIndexValue(Instruction *)");
}

Assistant:

uint64_t UpgradeMemoryModel::GetIndexValue(Instruction* index_inst) {
  const analysis::Constant* index_constant =
      context()->get_constant_mgr()->GetConstantFromInst(index_inst);
  assert(index_constant->AsIntConstant());
  if (index_constant->type()->AsInteger()->IsSigned()) {
    if (index_constant->type()->AsInteger()->width() == 32) {
      return index_constant->GetS32();
    } else {
      return index_constant->GetS64();
    }
  } else {
    if (index_constant->type()->AsInteger()->width() == 32) {
      return index_constant->GetU32();
    } else {
      return index_constant->GetU64();
    }
  }
}